

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrmatrix.cpp
# Opt level: O2

void __thiscall
TPZDohrMatrix<float,_TPZDohrSubstructCondense<float>_>::MultAdd
          (TPZDohrMatrix<float,_TPZDohrSubstructCondense<float>_> *this,TPZFMatrix<float> *x,
          TPZFMatrix<float> *y,TPZFMatrix<float> *z,float alpha,float beta,int opt)

{
  SubsList *pSVar1;
  size_t sVar2;
  double object;
  TPZDohrAssembleList<float> *this_00;
  int iVar3;
  long lVar4;
  long lVar5;
  _List_node_base *p_Var6;
  thread assembleThread;
  TPZAutoPointer<TPZDohrAssembleList<float>_> assemblelist;
  vector<std::thread,_std::allocator<std::thread>_> listThreads;
  TPZDohrThreadMultList<float,_TPZDohrSubstructCondense<float>_> multwork;
  TPZSimpleTimer mult;
  thread local_1f0;
  float local_1e4;
  TPZAutoPointer<TPZDohrAssembleList<float>_> local_1e0;
  TPZFMatrix<float> *local_1d8;
  TPZDohrAssembleList<float> *local_1d0;
  TPZAutoPointer<TPZDohrSubstructCondense<float>_> local_1c8;
  TPZAutoPointer<TPZDohrAssembly<float>_> local_1c0;
  TPZAutoPointer<TPZDohrAssembly<float>_> local_1b8;
  TPZFMatrix<float> local_1b0;
  undefined1 local_120 [64];
  _List_node_base local_e0;
  size_t local_d0;
  TPZAutoPointer<TPZDohrAssembleList<float>_> local_c8;
  TPZSimpleTimer local_90;
  
  local_1d8 = (TPZFMatrix<float> *)CONCAT44(local_1d8._4_4_,beta);
  local_1e4 = alpha;
  TPZSimpleTimer::TPZSimpleTimer(&local_90);
  if (opt == 0) {
    lVar4 = (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
    if (lVar4 == (x->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow) goto LAB_01286c36;
  }
  else {
    lVar4 = (x->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
LAB_01286c36:
    if ((this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow == lVar4) goto LAB_01286c4a;
  }
  TPZMatrix<float>::Error("Operator* <matrixs with incompatible dimensions>",(char *)0x0);
LAB_01286c4a:
  lVar4 = (x->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
  if ((((lVar4 != (y->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol) ||
       (lVar4 != (z->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol)) ||
      (lVar4 = (x->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow,
      lVar4 != (y->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow)) ||
     (lVar4 != (z->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow)) {
    TPZMatrix<float>::Error("TPZFMatrix::MultiplyAdd incompatible dimensions\n",(char *)0x0);
  }
  TPZMatrix<float>::PrepareZ(&this->super_TPZMatrix<float>,y,z,local_1d8._0_4_,opt);
  pSVar1 = &this->fGlobal;
  if (this->fNumThreads == 0) {
    iVar3 = 0;
    p_Var6 = (_List_node_base *)pSVar1;
    local_1d8 = x;
    while (p_Var6 = (((_List_base<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
                       *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var6 != (_List_node_base *)pSVar1) {
      TPZFMatrix<float>::TPZFMatrix((TPZFMatrix<float> *)local_120);
      TPZFMatrix<float>::TPZFMatrix(&local_1b0);
      TPZDohrAssembly<float>::Extract
                (((this->fAssembly).fRef)->fPointer,iVar3,local_1d8,(TPZFMatrix<float> *)local_120);
      TPZFMatrix<float>::Redim
                (&local_1b0,CONCAT44(local_120._12_4_,local_120._8_4_),local_120._16_8_);
      TPZDohrSubstructCondense<float>::ContributeKULocal
                (*(TPZDohrSubstructCondense<float> **)p_Var6[1]._M_next,local_1e4,
                 (TPZFMatrix<float> *)local_120,&local_1b0);
      TPZDohrAssembly<float>::Assemble(((this->fAssembly).fRef)->fPointer,iVar3,&local_1b0,z);
      TPZFMatrix<float>::~TPZFMatrix(&local_1b0);
      TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)local_120);
      iVar3 = iVar3 + 1;
    }
  }
  else {
    sVar2 = (this->fGlobal).
            super__List_base<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
            ._M_impl._M_node._M_size;
    this_00 = (TPZDohrAssembleList<float> *)operator_new(0xe0);
    local_1c0.fRef = (this->fAssembly).fRef;
    LOCK();
    ((local_1c0.fRef)->fCounter).super___atomic_base<int>._M_i =
         ((local_1c0.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    TPZDohrAssembleList<float>::TPZDohrAssembleList(this_00,(int)sVar2,z,&local_1c0);
    iVar3 = 0;
    TPZAutoPointer<TPZDohrAssembleList<float>_>::TPZAutoPointer(&local_1e0,this_00);
    TPZAutoPointer<TPZDohrAssembly<float>_>::~TPZAutoPointer(&local_1c0);
    local_1b8.fRef = (this->fAssembly).fRef;
    LOCK();
    ((local_1b8.fRef)->fCounter).super___atomic_base<int>._M_i =
         ((local_1b8.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_e0._M_next = &local_e0;
    local_120._8_4_ = local_1e4;
    local_120._16_8_ = 0;
    local_120._24_8_ = 0;
    local_120._32_8_ = 0;
    local_120._40_8_ = (__pthread_internal_list *)0x0;
    local_120._48_8_ = (__pthread_internal_list *)0x0;
    LOCK();
    ((local_1b8.fRef)->fCounter).super___atomic_base<int>._M_i =
         ((local_1b8.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_d0 = 0;
    local_c8.fRef = local_1e0.fRef;
    LOCK();
    ((local_1e0.fRef)->fCounter).super___atomic_base<int>._M_i =
         ((local_1e0.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_120._0_8_ = x;
    local_120._56_8_ = local_1b8.fRef;
    local_e0._M_prev = local_e0._M_next;
    TPZAutoPointer<TPZDohrAssembly<float>_>::~TPZAutoPointer(&local_1b8);
    p_Var6 = (_List_node_base *)pSVar1;
    while (p_Var6 = (((_List_base<TPZAutoPointer<TPZDohrSubstructCondense<float>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<float>_>_>_>
                       *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var6 != (_List_node_base *)pSVar1) {
      local_1c8.fRef = (TPZReference *)p_Var6[1]._M_next;
      LOCK();
      ((local_1c8.fRef)->fCounter).super___atomic_base<int>._M_i =
           ((local_1c8.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      ((local_1c8.fRef)->fCounter).super___atomic_base<int>._M_i =
           ((local_1c8.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_1b0.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable._0_4_ =
           iVar3;
      local_1b0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = (int64_t)local_1c8.fRef;
      TPZAutoPointer<TPZDohrSubstructCondense<float>_>::~TPZAutoPointer(&local_1c8);
      TPZDohrThreadMultList<float,_TPZDohrSubstructCondense<float>_>::AddItem
                ((TPZDohrThreadMultList<float,_TPZDohrSubstructCondense<float>_> *)local_120,
                 (TPZDohrThreadMultData<TPZDohrSubstructCondense<float>_> *)&local_1b0);
      TPZAutoPointer<TPZDohrSubstructCondense<float>_>::~TPZAutoPointer
                ((TPZAutoPointer<TPZDohrSubstructCondense<float>_> *)
                 &local_1b0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow);
      iVar3 = iVar3 + 1;
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)&local_1b0,
               (long)this->fNumThreads,(allocator_type *)&local_1f0);
    lVar4 = 0;
    for (lVar5 = 0; lVar5 < this->fNumThreads; lVar5 = lVar5 + 1) {
      local_1d0 = (TPZDohrAssembleList<float> *)local_120;
      std::thread::
      thread<void*(&)(void*),TPZDohrThreadMultList<float,TPZDohrSubstructCondense<float>>*,void>
                (&local_1f0,
                 TPZDohrThreadMultList<float,_TPZDohrSubstructCondense<float>_>::ThreadWork,
                 (TPZDohrThreadMultList<float,_TPZDohrSubstructCondense<float>_> **)&local_1d0);
      std::thread::operator=
                ((thread *)
                 (CONCAT44(local_1b0.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable.
                           _vptr_TPZSavable._4_4_,
                           (int)local_1b0.super_TPZMatrix<float>.super_TPZBaseMatrix.
                                super_TPZSavable._vptr_TPZSavable) + lVar4),&local_1f0);
      std::thread::~thread(&local_1f0);
      lVar4 = lVar4 + 8;
    }
    local_1d0 = (local_1e0.fRef)->fPointer;
    std::thread::thread<void*(&)(void*),TPZDohrAssembleList<float>*,void>
              (&local_1f0,TPZDohrAssembleList<float>::Assemble,&local_1d0);
    std::thread::join();
    for (lVar4 = 0; lVar4 < this->fNumThreads; lVar4 = lVar4 + 1) {
      std::thread::join();
    }
    std::thread::~thread(&local_1f0);
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)&local_1b0);
    TPZDohrThreadMultList<float,_TPZDohrSubstructCondense<float>_>::~TPZDohrThreadMultList
              ((TPZDohrThreadMultList<float,_TPZDohrSubstructCondense<float>_> *)local_120);
    TPZAutoPointer<TPZDohrAssembleList<float>_>::~TPZAutoPointer(&local_1e0);
  }
  object = TPZSimpleTimer::ReturnTimeDouble(&local_90);
  TPZStack<double,_10>::Push(&tempo.fMultiply,object);
  TPZSimpleTimer::~TPZSimpleTimer(&local_90);
  return;
}

Assistant:

void TPZDohrMatrix<TVar,TSubStruct>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
											 const TVar alpha,const TVar beta,const int opt) const
{
    
#ifdef USING_TBB 
        MultAddTBB(x, y, z, alpha, beta, opt);
        return;
#endif
        
	TPZSimpleTimer mult;
	if ((!opt && this->Cols() != x.Rows()) || this->Rows() != x.Rows())
		this->Error( "Operator* <matrixs with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Cols() != z.Cols() || x.Rows() != y.Rows() || x.Rows() != z.Rows()) {
		this->Error ("TPZFMatrix::MultiplyAdd incompatible dimensions\n");
	}
	this->PrepareZ(y,z,beta,opt);
	
	typename SubsList::const_iterator iter;
	int isub = 0;
	if (fNumThreads == 0) {
		for (iter=fGlobal.begin();iter!=fGlobal.end();iter++,isub++) {
            if(0)
            {
                TPZPersistenceManager::OpenWrite("dohr.txt");
                TPZPersistenceManager::WriteToFile(fAssembly.operator ->());
                TPZPersistenceManager::WriteToFile(&x);
                TPZAutoPointer<TSubStruct> point(*iter);
                TPZPersistenceManager::WriteToFile(point.operator ->());
                TPZPersistenceManager::CloseWrite();
                
            }
			TPZFMatrix<TVar> xlocal,zlocal;
			fAssembly->Extract(isub,x,xlocal);
			zlocal.Redim(xlocal.Rows(),xlocal.Cols());
			(*iter)->ContributeKULocal(alpha,xlocal,zlocal);
			fAssembly->Assemble(isub,zlocal,z);
			//         z.Print("Resultado intermediario");
		}		
	}
	else {
        unsigned int nglob = fGlobal.size();
		TPZAutoPointer<TPZDohrAssembleList<TVar> > assemblelist = new TPZDohrAssembleList<TVar>(nglob,z,this->fAssembly);
		
		TPZDohrThreadMultList<TVar,TSubStruct> multwork(x,alpha,fAssembly,assemblelist);
		typename std::list<TPZAutoPointer<TSubStruct> >::const_iterator iter;
		int isub=0;
		for (iter=fGlobal.begin(); iter!=fGlobal.end(); iter++,isub++) {
			TPZDohrThreadMultData<TSubStruct> data(isub,*iter);
            
            multwork.AddItem(data);
		}
		std::vector<std::thread> listThreads(fNumThreads);
        int i;
        for (i = 0; i < fNumThreads; i++) {
              listThreads[i] = std::thread(TPZDohrThreadMultList<TVar,TSubStruct>::ThreadWork, &multwork);
        }
        std::thread assembleThread(TPZDohrAssembleList<TVar>::Assemble, assemblelist.operator->());
        assembleThread.join();
        for (i = 0; i < fNumThreads; i++) {
          listThreads[i].join();
        }
	}
	tempo.fMultiply.Push(mult.ReturnTimeDouble());
}